

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void bcemit_branch_t(FuncState *fs,ExpDesc *e)

{
  FuncState *in_RSI;
  FuncState *in_RDI;
  BCPos pc;
  FuncState *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  BCPos list;
  
  expr_discharge(in_RSI,(ExpDesc *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (((*(int *)&in_RSI->ls == 3) || (*(int *)&in_RSI->ls == 4)) || (*(int *)&in_RSI->ls == 2)) {
    list = 0xffffffff;
  }
  else if (*(int *)&in_RSI->ls == 10) {
    invertcond(in_RDI,(ExpDesc *)in_RSI);
    list = *(BCPos *)&in_RSI->kt;
  }
  else if ((*(int *)&in_RSI->ls == 1) || (*(int *)&in_RSI->ls == 0)) {
    expr_toreg_nobranch((FuncState *)e,(ExpDesc *)unaff_retaddr,(BCReg)((ulong)in_RDI >> 0x20));
    list = bcemit_jmp(in_RSI);
  }
  else {
    list = bcemit_branch(in_RDI,(ExpDesc *)in_RSI,in_stack_ffffffffffffffec);
  }
  jmp_append(unaff_retaddr,(BCPos *)in_RDI,(BCPos)((ulong)in_RSI >> 0x20));
  jmp_tohere(in_RSI,list);
  *(undefined4 *)((long)&in_RSI->ls + 4) = 0xffffffff;
  return;
}

Assistant:

static void bcemit_branch_t(FuncState *fs, ExpDesc *e)
{
  BCPos pc;
  expr_discharge(fs, e);
  if (e->k == VKSTR || e->k == VKNUM || e->k == VKTRUE)
    pc = NO_JMP;  /* Never jump. */
  else if (e->k == VJMP)
    invertcond(fs, e), pc = e->u.s.info;
  else if (e->k == VKFALSE || e->k == VKNIL)
    expr_toreg_nobranch(fs, e, NO_REG), pc = bcemit_jmp(fs);
  else
    pc = bcemit_branch(fs, e, 0);
  jmp_append(fs, &e->f, pc);
  jmp_tohere(fs, e->t);
  e->t = NO_JMP;
}